

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

void UnixVfs_TempDir(jx9_context *pCtx)

{
  int iVar1;
  char *__name;
  jx9_value *pVal;
  long lVar2;
  stat buf;
  stat local_c0;
  
  __name = getenv("TMPDIR");
  if ((__name != (char *)0x0) && (*__name != '\0')) {
    iVar1 = access(__name,7);
    if (iVar1 == 0) {
      pVal = pCtx->pRet;
LAB_00142208:
      iVar1 = -1;
      goto LAB_0014220d;
    }
  }
  lVar2 = 0;
  do {
    __name = *(char **)((long)UnixVfs_TempDir::azDirs + lVar2);
    iVar1 = stat(__name,&local_c0);
    if ((iVar1 == 0) && ((local_c0.st_mode & 0xf000) == 0x4000)) {
      iVar1 = access(__name,7);
      if (iVar1 == 0) {
        pVal = pCtx->pRet;
        goto LAB_00142208;
      }
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x18);
  pVal = pCtx->pRet;
  __name = "/tmp";
  iVar1 = 4;
LAB_0014220d:
  jx9_value_string(pVal,__name,iVar1);
  return;
}

Assistant:

static void UnixVfs_TempDir(jx9_context *pCtx)
{
	static const char *azDirs[] = {
     "/var/tmp", 
     "/usr/tmp", 
	 "/usr/local/tmp"
  };
  unsigned int i;
  struct stat buf;
  const char *zDir;
  zDir = getenv("TMPDIR");
  if( zDir && zDir[0] != 0 && !access(zDir, 07) ){
	  jx9_result_string(pCtx, zDir, -1);
	  return;
  }
  for(i=0; i<sizeof(azDirs)/sizeof(azDirs[0]); i++){
	zDir=azDirs[i];
    if( zDir==0 ) continue;
    if( stat(zDir, &buf) ) continue;
    if( !S_ISDIR(buf.st_mode) ) continue;
    if( access(zDir, 07) ) continue;
    /* Got one */
	jx9_result_string(pCtx, zDir, -1);
	return;
  }
  /* Default temp dir */
  jx9_result_string(pCtx, "/tmp", (int)sizeof("/tmp")-1);
}